

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  ulong uVar2;
  UnitTest *pUVar3;
  char *pcVar4;
  string *psVar5;
  string *in_RDI;
  string local_280 [32];
  FilePath local_260;
  undefined1 local_240 [8];
  FilePath result;
  string local_218;
  FilePath local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  FilePath local_1b0;
  FilePath local_190;
  allocator<char> local_169;
  string local_168;
  undefined1 local_148 [8];
  FilePath output_name;
  string local_120;
  FilePath local_100;
  allocator<char> local_d9;
  string local_d8;
  FilePath local_b8;
  FilePath local_98;
  char *local_78;
  char *colon;
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [8];
  string format;
  char *gtest_output_flag;
  
  format.field_2._8_8_ = std::__cxx11::string::c_str();
  GetOutputFormat_abi_cxx11_();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,"xml",&local_59);
    std::__cxx11::string::operator=(local_38,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  local_78 = strchr((char *)format.field_2._8_8_,0x3a);
  if (local_78 == (char *)0x0) {
    pUVar3 = UnitTest::GetInstance();
    pcVar4 = UnitTest::original_working_dir(pUVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar4,&local_d9);
    FilePath::FilePath(&local_b8,&local_d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"test_detail",
               (allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
    FilePath::FilePath(&local_100,&local_120);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    FilePath::MakeFileName(&local_98,&local_b8,&local_100,0,pcVar4);
    psVar5 = FilePath::string_abi_cxx11_(&local_98);
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
    FilePath::~FilePath(&local_98);
    FilePath::~FilePath(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator
              ((allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
    FilePath::~FilePath(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    output_name.pathname_.field_2._8_4_ = 1;
  }
  else {
    pcVar4 = local_78 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,pcVar4,&local_169);
    FilePath::FilePath((FilePath *)local_148,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    bVar1 = FilePath::IsAbsolutePath((FilePath *)local_148);
    if (!bVar1) {
      pUVar3 = UnitTest::GetInstance();
      pcVar4 = UnitTest::original_working_dir(pUVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,pcVar4,&local_1d1);
      FilePath::FilePath(&local_1b0,&local_1d0);
      pcVar4 = local_78 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,pcVar4,
                 (allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
      FilePath::FilePath(&local_1f8,&local_218);
      FilePath::ConcatPaths(&local_190,&local_1b0,&local_1f8);
      FilePath::operator=((FilePath *)local_148,&local_190);
      FilePath::~FilePath(&local_190);
      FilePath::~FilePath(&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator
                ((allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
      FilePath::~FilePath(&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
    }
    bVar1 = FilePath::IsDirectory((FilePath *)local_148);
    if (bVar1) {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      FilePath::GenerateUniqueFileName
                ((FilePath *)local_240,(FilePath *)local_148,&local_260,pcVar4);
      std::__cxx11::string::~string(local_280);
      FilePath::~FilePath(&local_260);
      psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_240);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
      output_name.pathname_.field_2._8_4_ = 1;
      FilePath::~FilePath((FilePath *)local_240);
    }
    else {
      psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_148);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
      output_name.pathname_.field_2._8_4_ = 1;
    }
    FilePath::~FilePath((FilePath *)local_148);
  }
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();

  std::string format = GetOutputFormat();
  if (format.empty())
    format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile), 0,
        format.c_str()).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}